

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix2f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  matrix2f value_1;
  matrix2f value;
  string local_60;
  matrix2f local_40;
  
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    local_40.m[0][0] = 1.0;
    local_40.m[0][1] = 0.0;
    local_40.m[1][0] = 0.0;
    local_40.m[1][1] = 1.0;
    bVar5 = ParseMatrix(this,&local_40);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>::
        _M_realloc_insert<tinyusdz::value::matrix2f_const&>
                  ((vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>> *)
                   result,iVar3,&local_40);
      }
      else {
        (iVar3._M_current)->m[0] = local_40.m[0];
        (iVar3._M_current)->m[1] = local_40.m[1];
        ppmVar1 = &(result->
                   super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppmVar1 = *ppmVar1 + 1;
      }
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Not starting with the value of requested type.\n","");
      PushError(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003d3943;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_40);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_40.m[0][0]._0_1_ == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_60);
              cVar7 = ((char)local_60._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if ((char)local_60._M_dataplus._M_p != end_symbol && bVar5) goto LAB_003d38a9;
            }
          }
          else {
LAB_003d38a9:
            if (local_40.m[0][0]._0_1_ == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                local_60._M_dataplus._M_p = (pointer)0x3f800000;
                local_60._M_string_length._0_4_ = 0.0;
                local_60._M_string_length._4_4_ = 1.0;
                bVar5 = ParseMatrix(this,(matrix2f *)&local_60);
                cVar7 = '\x03';
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>::
                    _M_realloc_insert<tinyusdz::value::matrix2f_const&>
                              ((vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>
                                *)result,iVar3,(matrix2f *)&local_60);
                  }
                  else {
                    (iVar3._M_current)->m[0] = (float  [2])local_60._M_dataplus._M_p;
                    (iVar3._M_current)->m[1] = (float  [2])local_60._M_string_length;
                    ppmVar1 = &(result->
                               super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppmVar1 = *ppmVar1 + 1;
                  }
                  cVar7 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_003d3943:
        if ((result->
            super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Empty array.\n","");
        PushError(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}